

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.cc
# Opt level: O0

void md4_block_data_order(uint32_t *state,uint8_t *data,size_t num)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t X15;
  uint32_t X14;
  uint32_t X13;
  uint32_t X12;
  uint32_t X11;
  uint32_t X10;
  uint32_t X9;
  uint32_t X8;
  uint32_t X7;
  uint32_t X6;
  uint32_t X5;
  uint32_t X4;
  uint32_t X3;
  uint32_t X2;
  uint32_t X1;
  uint32_t X0;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  size_t num_local;
  uint8_t *data_local;
  uint32_t *state_local;
  
  C = *state;
  D = state[1];
  X0 = state[2];
  X1 = state[3];
  _B = num;
  num_local = (size_t)data;
  while (_B != 0) {
    uVar1 = CRYPTO_load_u32_le((void *)num_local);
    uVar2 = CRYPTO_load_u32_le((void *)(num_local + 4));
    uVar3 = CRYPTO_rotl_u32(uVar1 + ((X0 ^ X1) & D ^ X1) + C,3);
    uVar4 = CRYPTO_load_u32_le((void *)(num_local + 8));
    uVar5 = CRYPTO_rotl_u32(uVar2 + ((D ^ X0) & uVar3 ^ X0) + X1,7);
    uVar6 = CRYPTO_load_u32_le((void *)(num_local + 0xc));
    uVar7 = CRYPTO_rotl_u32(uVar4 + ((uVar3 ^ D) & uVar5 ^ D) + X0,0xb);
    uVar8 = CRYPTO_load_u32_le((void *)(num_local + 0x10));
    uVar9 = CRYPTO_rotl_u32(uVar6 + ((uVar5 ^ uVar3) & uVar7 ^ uVar3) + D,0x13);
    uVar10 = CRYPTO_load_u32_le((void *)(num_local + 0x14));
    uVar3 = CRYPTO_rotl_u32(uVar8 + ((uVar7 ^ uVar5) & uVar9 ^ uVar5) + uVar3,3);
    uVar11 = CRYPTO_load_u32_le((void *)(num_local + 0x18));
    uVar5 = CRYPTO_rotl_u32(uVar10 + ((uVar9 ^ uVar7) & uVar3 ^ uVar7) + uVar5,7);
    uVar12 = CRYPTO_load_u32_le((void *)(num_local + 0x1c));
    uVar7 = CRYPTO_rotl_u32(uVar11 + ((uVar3 ^ uVar9) & uVar5 ^ uVar9) + uVar7,0xb);
    uVar13 = CRYPTO_load_u32_le((void *)(num_local + 0x20));
    uVar9 = CRYPTO_rotl_u32(uVar12 + ((uVar5 ^ uVar3) & uVar7 ^ uVar3) + uVar9,0x13);
    uVar14 = CRYPTO_load_u32_le((void *)(num_local + 0x24));
    uVar3 = CRYPTO_rotl_u32(uVar13 + ((uVar7 ^ uVar5) & uVar9 ^ uVar5) + uVar3,3);
    uVar15 = CRYPTO_load_u32_le((void *)(num_local + 0x28));
    uVar5 = CRYPTO_rotl_u32(uVar14 + ((uVar9 ^ uVar7) & uVar3 ^ uVar7) + uVar5,7);
    uVar16 = CRYPTO_load_u32_le((void *)(num_local + 0x2c));
    uVar7 = CRYPTO_rotl_u32(uVar15 + ((uVar3 ^ uVar9) & uVar5 ^ uVar9) + uVar7,0xb);
    uVar17 = CRYPTO_load_u32_le((void *)(num_local + 0x30));
    uVar9 = CRYPTO_rotl_u32(uVar16 + ((uVar5 ^ uVar3) & uVar7 ^ uVar3) + uVar9,0x13);
    uVar18 = CRYPTO_load_u32_le((void *)(num_local + 0x34));
    uVar3 = CRYPTO_rotl_u32(uVar17 + ((uVar7 ^ uVar5) & uVar9 ^ uVar5) + uVar3,3);
    uVar19 = CRYPTO_load_u32_le((void *)(num_local + 0x38));
    uVar5 = CRYPTO_rotl_u32(uVar18 + ((uVar9 ^ uVar7) & uVar3 ^ uVar7) + uVar5,7);
    uVar20 = CRYPTO_load_u32_le((void *)(num_local + 0x3c));
    num_local = num_local + 0x40;
    uVar7 = CRYPTO_rotl_u32(uVar19 + ((uVar3 ^ uVar9) & uVar5 ^ uVar9) + uVar7,0xb);
    uVar9 = CRYPTO_rotl_u32(uVar20 + ((uVar5 ^ uVar3) & uVar7 ^ uVar3) + uVar9,0x13);
    uVar3 = CRYPTO_rotl_u32(uVar3 + uVar1 + 0x5a827999 + (uVar9 & (uVar7 | uVar5) | uVar7 & uVar5),3
                           );
    uVar5 = CRYPTO_rotl_u32(uVar5 + uVar8 + 0x5a827999 + (uVar3 & (uVar9 | uVar7) | uVar9 & uVar7),5
                           );
    uVar7 = CRYPTO_rotl_u32(uVar7 + uVar13 + 0x5a827999 + (uVar5 & (uVar3 | uVar9) | uVar3 & uVar9),
                            9);
    uVar9 = CRYPTO_rotl_u32(uVar9 + uVar17 + 0x5a827999 + (uVar7 & (uVar5 | uVar3) | uVar5 & uVar3),
                            0xd);
    uVar3 = CRYPTO_rotl_u32(uVar3 + uVar2 + 0x5a827999 + (uVar9 & (uVar7 | uVar5) | uVar7 & uVar5),3
                           );
    uVar5 = CRYPTO_rotl_u32(uVar5 + uVar10 + 0x5a827999 + (uVar3 & (uVar9 | uVar7) | uVar9 & uVar7),
                            5);
    uVar7 = CRYPTO_rotl_u32(uVar7 + uVar14 + 0x5a827999 + (uVar5 & (uVar3 | uVar9) | uVar3 & uVar9),
                            9);
    uVar9 = CRYPTO_rotl_u32(uVar9 + uVar18 + 0x5a827999 + (uVar7 & (uVar5 | uVar3) | uVar5 & uVar3),
                            0xd);
    uVar3 = CRYPTO_rotl_u32(uVar3 + uVar4 + 0x5a827999 + (uVar9 & (uVar7 | uVar5) | uVar7 & uVar5),3
                           );
    uVar5 = CRYPTO_rotl_u32(uVar5 + uVar11 + 0x5a827999 + (uVar3 & (uVar9 | uVar7) | uVar9 & uVar7),
                            5);
    uVar7 = CRYPTO_rotl_u32(uVar7 + uVar15 + 0x5a827999 + (uVar5 & (uVar3 | uVar9) | uVar3 & uVar9),
                            9);
    uVar9 = CRYPTO_rotl_u32(uVar9 + uVar19 + 0x5a827999 + (uVar7 & (uVar5 | uVar3) | uVar5 & uVar3),
                            0xd);
    uVar3 = CRYPTO_rotl_u32(uVar3 + uVar6 + 0x5a827999 + (uVar9 & (uVar7 | uVar5) | uVar7 & uVar5),3
                           );
    uVar5 = CRYPTO_rotl_u32(uVar5 + uVar12 + 0x5a827999 + (uVar3 & (uVar9 | uVar7) | uVar9 & uVar7),
                            5);
    uVar7 = CRYPTO_rotl_u32(uVar7 + uVar16 + 0x5a827999 + (uVar5 & (uVar3 | uVar9) | uVar3 & uVar9),
                            9);
    uVar9 = CRYPTO_rotl_u32(uVar9 + uVar20 + 0x5a827999 + (uVar7 & (uVar5 | uVar3) | uVar5 & uVar3),
                            0xd);
    uVar1 = CRYPTO_rotl_u32(uVar3 + uVar1 + 0x6ed9eba1 + (uVar9 ^ uVar7 ^ uVar5),3);
    uVar3 = CRYPTO_rotl_u32(uVar5 + uVar13 + 0x6ed9eba1 + (uVar1 ^ uVar9 ^ uVar7),9);
    uVar5 = CRYPTO_rotl_u32(uVar7 + uVar8 + 0x6ed9eba1 + (uVar3 ^ uVar1 ^ uVar9),0xb);
    uVar7 = CRYPTO_rotl_u32(uVar9 + uVar17 + 0x6ed9eba1 + (uVar5 ^ uVar3 ^ uVar1),0xf);
    uVar1 = CRYPTO_rotl_u32(uVar1 + uVar4 + 0x6ed9eba1 + (uVar7 ^ uVar5 ^ uVar3),3);
    uVar3 = CRYPTO_rotl_u32(uVar3 + uVar15 + 0x6ed9eba1 + (uVar1 ^ uVar7 ^ uVar5),9);
    uVar4 = CRYPTO_rotl_u32(uVar5 + uVar11 + 0x6ed9eba1 + (uVar3 ^ uVar1 ^ uVar7),0xb);
    uVar5 = CRYPTO_rotl_u32(uVar7 + uVar19 + 0x6ed9eba1 + (uVar4 ^ uVar3 ^ uVar1),0xf);
    uVar1 = CRYPTO_rotl_u32(uVar1 + uVar2 + 0x6ed9eba1 + (uVar5 ^ uVar4 ^ uVar3),3);
    uVar2 = CRYPTO_rotl_u32(uVar3 + uVar14 + 0x6ed9eba1 + (uVar1 ^ uVar5 ^ uVar4),9);
    uVar3 = CRYPTO_rotl_u32(uVar4 + uVar10 + 0x6ed9eba1 + (uVar2 ^ uVar1 ^ uVar5),0xb);
    uVar4 = CRYPTO_rotl_u32(uVar5 + uVar18 + 0x6ed9eba1 + (uVar3 ^ uVar2 ^ uVar1),0xf);
    uVar1 = CRYPTO_rotl_u32(uVar1 + uVar6 + 0x6ed9eba1 + (uVar4 ^ uVar3 ^ uVar2),3);
    uVar2 = CRYPTO_rotl_u32(uVar2 + uVar16 + 0x6ed9eba1 + (uVar1 ^ uVar4 ^ uVar3),9);
    uVar3 = CRYPTO_rotl_u32(uVar3 + uVar12 + 0x6ed9eba1 + (uVar2 ^ uVar1 ^ uVar4),0xb);
    uVar4 = CRYPTO_rotl_u32(uVar4 + uVar20 + 0x6ed9eba1 + (uVar3 ^ uVar2 ^ uVar1),0xf);
    C = uVar1 + *state;
    *state = C;
    D = uVar4 + state[1];
    state[1] = D;
    X0 = uVar3 + state[2];
    state[2] = X0;
    X1 = uVar2 + state[3];
    state[3] = X1;
    _B = _B - 1;
  }
  return;
}

Assistant:

static void md4_block_data_order(uint32_t *state, const uint8_t *data,
                                 size_t num) {
  uint32_t A, B, C, D;
  uint32_t X0, X1, X2, X3, X4, X5, X6, X7, X8, X9, X10, X11, X12, X13, X14, X15;

  A = state[0];
  B = state[1];
  C = state[2];
  D = state[3];

  for (; num--;) {
    X0 = CRYPTO_load_u32_le(data);
    data += 4;
    X1 = CRYPTO_load_u32_le(data);
    data += 4;
    // Round 0
    R0(A, B, C, D, X0, 3, 0);
    X2 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X1, 7, 0);
    X3 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X2, 11, 0);
    X4 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(B, C, D, A, X3, 19, 0);
    X5 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(A, B, C, D, X4, 3, 0);
    X6 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X5, 7, 0);
    X7 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X6, 11, 0);
    X8 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(B, C, D, A, X7, 19, 0);
    X9 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(A, B, C, D, X8, 3, 0);
    X10 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X9, 7, 0);
    X11 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X10, 11, 0);
    X12 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(B, C, D, A, X11, 19, 0);
    X13 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(A, B, C, D, X12, 3, 0);
    X14 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X13, 7, 0);
    X15 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X14, 11, 0);
    R0(B, C, D, A, X15, 19, 0);
    // Round 1
    R1(A, B, C, D, X0, 3, 0x5A827999L);
    R1(D, A, B, C, X4, 5, 0x5A827999L);
    R1(C, D, A, B, X8, 9, 0x5A827999L);
    R1(B, C, D, A, X12, 13, 0x5A827999L);
    R1(A, B, C, D, X1, 3, 0x5A827999L);
    R1(D, A, B, C, X5, 5, 0x5A827999L);
    R1(C, D, A, B, X9, 9, 0x5A827999L);
    R1(B, C, D, A, X13, 13, 0x5A827999L);
    R1(A, B, C, D, X2, 3, 0x5A827999L);
    R1(D, A, B, C, X6, 5, 0x5A827999L);
    R1(C, D, A, B, X10, 9, 0x5A827999L);
    R1(B, C, D, A, X14, 13, 0x5A827999L);
    R1(A, B, C, D, X3, 3, 0x5A827999L);
    R1(D, A, B, C, X7, 5, 0x5A827999L);
    R1(C, D, A, B, X11, 9, 0x5A827999L);
    R1(B, C, D, A, X15, 13, 0x5A827999L);
    // Round 2
    R2(A, B, C, D, X0, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X8, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X4, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X12, 15, 0x6ED9EBA1L);
    R2(A, B, C, D, X2, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X10, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X6, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X14, 15, 0x6ED9EBA1L);
    R2(A, B, C, D, X1, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X9, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X5, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X13, 15, 0x6ED9EBA1L);
    R2(A, B, C, D, X3, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X11, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X7, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X15, 15, 0x6ED9EBA1L);

    A = state[0] += A;
    B = state[1] += B;
    C = state[2] += C;
    D = state[3] += D;
  }
}